

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::draw_image
          (CImg<unsigned_int> *this,int x0,int y0,int z0,int c0,CImg<unsigned_int> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  CImg<unsigned_int> *pCVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar32;
  float fVar33;
  long local_168;
  long local_150;
  CImg<unsigned_int> local_68;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  puVar3 = this->_data;
  uVar10 = this->_width;
  uVar15 = this->_height;
  uVar11 = this->_depth;
  uVar23 = this->_spectrum;
  if ((uVar23 != 0 && ((uVar11 != 0 && uVar15 != 0) && (uVar10 != 0 && puVar3 != (uint *)0x0))) &&
     (puVar4 = sprite->_data, puVar4 != (uint *)0x0)) {
    uVar12 = sprite->_width;
    uVar20 = sprite->_height;
    uVar6 = sprite->_depth;
    uVar5 = sprite->_spectrum;
    if ((puVar4 < puVar3 + (ulong)uVar11 * (ulong)uVar23 * (ulong)uVar15 * (ulong)uVar10) &&
       (puVar3 < puVar4 + (ulong)uVar6 * (ulong)uVar5 * (ulong)uVar20 * (ulong)uVar12)) {
      CImg(&local_68,sprite,false);
      this = draw_image(this,x0,y0,z0,c0,&local_68,opacity);
      if ((local_68._is_shared == false) && (local_68._data != (uint *)0x0)) {
        operator_delete__(local_68._data);
      }
    }
    else {
      if ((((((((y0 == 0 && x0 == 0) && z0 == 0) && c0 == 0) && (1.0 <= opacity)) &&
            (uVar10 == uVar12)) && ((uVar15 == uVar20 && (uVar11 == uVar6)))) && (uVar23 == uVar5))
         && (this->_is_shared == false)) {
        pCVar7 = assign<unsigned_int>(this,sprite,false);
        return pCVar7;
      }
      uVar26 = 0;
      if (0 < x0) {
        uVar26 = x0;
      }
      uVar25 = 0;
      if (0 < y0) {
        uVar25 = y0;
      }
      uVar8 = 0;
      if (0 < z0) {
        uVar8 = z0;
      }
      uVar9 = 0;
      if (0 < c0) {
        uVar9 = c0;
      }
      uVar27 = uVar26 - x0;
      iVar29 = uVar10 - (uVar12 + x0);
      if ((int)(uVar12 + x0) <= (int)uVar10) {
        iVar29 = 0;
      }
      iVar29 = iVar29 + (uVar12 - uVar27);
      iVar14 = uVar15 - (uVar20 + y0);
      if ((int)(uVar20 + y0) <= (int)uVar15) {
        iVar14 = 0;
      }
      iVar22 = uVar11 - (uVar6 + z0);
      if ((int)(uVar6 + z0) <= (int)uVar11) {
        iVar22 = 0;
      }
      iVar19 = uVar23 - (uVar5 + c0);
      if ((int)(uVar5 + c0) <= (int)uVar23) {
        iVar19 = 0;
      }
      if (0 < iVar29) {
        uVar10 = uVar25 - y0;
        uVar15 = iVar14 + (uVar20 - uVar10);
        if (0 < (int)uVar15) {
          uVar11 = uVar8 - z0;
          uVar23 = iVar22 + (uVar6 - uVar11);
          if (0 < (int)uVar23) {
            uVar12 = uVar9 - c0;
            uVar20 = iVar19 + (uVar5 - uVar12);
            if (0 < (int)uVar20) {
              fVar33 = ABS(opacity);
              uStack_44 = in_XMM0_Db & 0x7fffffff;
              uStack_40 = in_XMM0_Dc & 0x7fffffff;
              uStack_3c = in_XMM0_Dd & 0x7fffffff;
              fVar32 = 0.0;
              if (0.0 <= opacity) {
                fVar32 = opacity;
              }
              local_150 = (ulong)uVar9 * 4;
              uVar18 = 0;
              uVar6 = uVar12;
              local_48 = fVar33;
              do {
                uVar13 = 0;
                local_168 = (ulong)uVar8 * 4;
                uVar5 = uVar11;
                do {
                  uVar30 = 0;
                  lVar31 = (ulong)uVar25 * 4;
                  uVar21 = uVar10;
                  do {
                    uVar24 = (ulong)this->_width;
                    uVar28 = (ulong)sprite->_width;
                    uVar1 = sprite->_height;
                    uVar2 = sprite->_depth;
                    puVar3 = this->_data;
                    puVar4 = sprite->_data;
                    if (1.0 <= opacity) {
                      lVar17 = this->_height * uVar24;
                      lVar16 = uVar1 * uVar28;
                      memcpy(puVar3 + (ulong)uVar26 +
                                      (uVar25 + uVar30) * uVar24 +
                                      lVar17 * (uVar8 + uVar13) +
                                      (ulong)this->_depth * (uVar9 + uVar18) * lVar17,
                             puVar4 + (ulong)uVar27 +
                                      (uVar10 + (int)uVar30) * uVar28 +
                                      lVar16 * (ulong)(uVar11 + (int)uVar13) +
                                      (ulong)uVar2 * (ulong)(uVar12 + (int)uVar18) * lVar16,
                             (long)iVar29 << 2);
                      fVar33 = local_48;
                    }
                    else {
                      lVar17 = (((ulong)this->_depth * local_150 + local_168) * (ulong)this->_height
                               + lVar31) * uVar24 + (ulong)uVar26 * 4;
                      lVar16 = 0;
                      do {
                        *(int *)((long)puVar3 + lVar16 * 4 + lVar17) =
                             (int)(long)((float)*(uint *)((long)puVar4 +
                                                         lVar16 * 4 +
                                                         (((ulong)uVar2 * (ulong)uVar6 * 4 +
                                                          (ulong)uVar5 * 4) * (ulong)uVar1 +
                                                         (ulong)uVar21 * 4) * uVar28 +
                                                         (ulong)uVar27 * 4) * fVar33 +
                                        (float)*(uint *)((long)puVar3 + lVar16 * 4 + lVar17) *
                                        (1.0 - fVar32));
                        lVar16 = lVar16 + 1;
                      } while ((int)lVar16 < iVar29);
                    }
                    uVar30 = uVar30 + 1;
                    uVar21 = uVar21 + 1;
                    lVar31 = lVar31 + 4;
                  } while (uVar30 < uVar15);
                  uVar13 = uVar13 + 1;
                  uVar5 = uVar5 + 1;
                  local_168 = local_168 + 4;
                } while (uVar13 < uVar23);
                uVar18 = uVar18 + 1;
                uVar6 = uVar6 + 1;
                local_150 = local_150 + 4;
              } while (uVar18 < uVar20);
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT slx = lx*sizeof(T);

      const float nopacity = cimg::abs(opacity), copacity = 1 - std::max(opacity,0.f);
      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const T *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              if (opacity>=1) std::memcpy(ptrd,ptrs,slx);
              else for (int x = 0; x<lx; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
            }
      }
      return *this;
    }